

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::Impl::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,Impl *this)

{
  Entry *pEVar1;
  Entry *schema;
  Entry *pEVar2;
  long lVar3;
  size_t size;
  
  size = 0;
  for (pEVar2 = (this->schemas).table.rows.builder.ptr;
      pEVar2 != (this->schemas).table.rows.builder.pos; pEVar2 = pEVar2 + 1) {
    size = size + (pEVar2->value->lazyInitializer == (Initializer *)0x0);
  }
  kj::heapArray<capnp::Schema>(__return_storage_ptr__,size);
  pEVar1 = (this->schemas).table.rows.builder.pos;
  lVar3 = 0;
  for (pEVar2 = (this->schemas).table.rows.builder.ptr; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    if (pEVar2->value->lazyInitializer == (Initializer *)0x0) {
      __return_storage_ptr__->ptr[lVar3].raw = &pEVar2->value->defaultBrand;
      lVar3 = lVar3 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::Impl::getAllLoaded() const {
  size_t count = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) ++count;
  }

  kj::Array<Schema> result = kj::heapArray<Schema>(count);
  size_t i = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) {
      result[i++] = Schema(&schema.value->defaultBrand);
    }
  }
  return result;
}